

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicEndResultInstance::prepareDescriptors
          (BinaryAtomicEndResultInstance *this)

{
  Move<vk::Handle<(vk::HandleType)21>_> *this_00;
  Move<vk::Handle<(vk::HandleType)19>_> *this_01;
  Move<vk::Handle<(vk::HandleType)22>_> *this_02;
  VkAllocationCallbacks *pVVar1;
  VkDevice device;
  DeviceInterface *vk;
  DescriptorSetLayoutBuilder *this_03;
  DescriptorPoolBuilder *this_04;
  DescriptorSetUpdateBuilder *this_05;
  VkDescriptorImageInfo descResultImageInfo;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_98;
  DescriptorSetLayoutBuilder local_78;
  
  device = Context::getDevice((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  vk = Context::getDeviceInterface
                 ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_78);
  this_03 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_78,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_98,this_03,vk,device,0);
  pVVar1 = local_98.m_data.deleter.m_allocator;
  descResultImageInfo._16_8_ = local_98.m_data.deleter.m_device;
  descResultImageInfo.sampler.m_internal = local_98.m_data.object.m_internal;
  descResultImageInfo.imageView.m_internal = (deUint64)local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal._0_4_ = 0;
  local_98.m_data.object.m_internal._4_4_ = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_01 = &(this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
  super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
       (VkDevice)descResultImageInfo._16_8_;
  (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
  super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator = pVVar1;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       descResultImageInfo.sampler.m_internal;
  (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
  super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)descResultImageInfo.imageView.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_98);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_78);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_98);
  this_04 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_98,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&descResultImageInfo,this_04,vk,device,1,1);
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)descResultImageInfo._16_8_;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar1;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descResultImageInfo.sampler.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descResultImageInfo.imageView.m_internal;
  descResultImageInfo.sampler.m_internal = 0;
  descResultImageInfo.imageView.m_internal = 0;
  descResultImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  descResultImageInfo._20_4_ = 0;
  this_00 = &(this->super_BinaryAtomicInstanceBase).m_descriptorPool;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
  super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
  super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_78.m_immutableSamplerInfos.
       super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
       (deUint64)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
  super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&descResultImageInfo);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_98);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&descResultImageInfo,vk,device,
                    (VkDescriptorPool)
                    (this->super_BinaryAtomicInstanceBase).m_descriptorPool.
                    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal,
                    (VkDescriptorSetLayout)
                    (this->super_BinaryAtomicInstanceBase).m_descriptorSetLayout.
                    super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)descResultImageInfo._16_8_;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descResultImageInfo.sampler.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descResultImageInfo.imageView.m_internal;
  descResultImageInfo.sampler.m_internal = 0;
  descResultImageInfo.imageView.m_internal = 0;
  descResultImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  descResultImageInfo._20_4_ = 0;
  this_02 = &(this->super_BinaryAtomicInstanceBase).m_descriptorSet;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (this->super_BinaryAtomicInstanceBase).m_descriptorSet.
  super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_BinaryAtomicInstanceBase).m_descriptorSet.
  super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       (deUint64)
       local_78.m_immutableSamplerInfos.
       super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
       (deUint64)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_BinaryAtomicInstanceBase).m_descriptorSet.
  super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&descResultImageInfo);
  descResultImageInfo.imageView.m_internal =
       (this->super_BinaryAtomicInstanceBase).m_resultImageView.
       super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  descResultImageInfo.sampler.m_internal = 0;
  descResultImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_78);
  local_98.m_data.object.m_internal._0_4_ = 0;
  local_98.m_data.object.m_internal._4_4_ = 0;
  this_05 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&local_78,
                       (VkDescriptorSet)
                       (this->super_BinaryAtomicInstanceBase).m_descriptorSet.
                       super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal,
                       (Location *)&local_98,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,&descResultImageInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_05,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_78);
  return;
}

Assistant:

void BinaryAtomicEndResultInstance::prepareDescriptors (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();

	m_descriptorSetLayout =
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, device);

	m_descriptorPool =
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(deviceInterface, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	m_descriptorSet = makeDescriptorSet(deviceInterface, device, *m_descriptorPool, *m_descriptorSetLayout);

	const VkDescriptorImageInfo	descResultImageInfo = makeDescriptorImageInfo(DE_NULL, *m_resultImageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descResultImageInfo)
		.update(deviceInterface, device);
}